

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O2

gs_val_t *
gs_c_fn_terrain_model_add_point
          (gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  golf_geo_point_t point;
  gs_val_type signature_arg_types [1];
  gs_val_t sig;
  
  signature_arg_types[0] = GS_VAL_VEC3;
  gs_c_fn_signature(&sig,eval,vals,num_vals,signature_arg_types,1);
  if (sig.is_return == true) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = sig.field_2._8_8_;
    __return_storage_ptr__->type = sig.type;
    __return_storage_ptr__->is_return = (_Bool)sig.is_return;
    *(int3 *)&__return_storage_ptr__->field_0x5 = sig._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = sig.field_2.vec2_val;
  }
  else {
    point = golf_geo_point((vals->field_2).vec3_val);
    golf_editor_edit_mode_geo_add_point(point);
    gs_val_void();
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_terrain_model_add_point(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_VEC3 };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);;
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    golf_geo_point_t point = golf_geo_point(vals[0].vec3_val);
    golf_editor_edit_mode_geo_add_point(point);
    return gs_val_void();
}